

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

int unGetc(int c)

{
  char *pcVar1;
  
  if (c != -1) {
    if (ctp <= inlinebuf + (uint)whichbuf) {
      diag("internal error in unGetc","");
    }
    pcVar1 = ctp + -1;
    ctp = ctp + -1;
    *pcVar1 = (char)c;
  }
  return c;
}

Assistant:

int unGetc(c)
	int             c;
{
	if (c == EOF)
		return c;
	if (ctp > inlinebuf[whichbuf]) {
		ctp--;
		*ctp = c;
	} else {
		diag("internal error in unGetc", "");
	}
	return c;
}